

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::StreamingReporterBase::testCaseEnded(StreamingReporterBase *this,TestCaseStats *param_1)

{
  Option<Catch::TestCaseInfo>::reset(&(this->currentTestCaseInfo).super_Option<Catch::TestCaseInfo>)
  ;
  (this->currentTestCaseInfo).used = false;
  if ((this->m_sectionStack).
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_sectionStack).
      super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  __assert_fail("m_sectionStack.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jjh13[P]sisl/test/../include/catch/catch.hpp"
                ,0xa01,
                "virtual void Catch::StreamingReporterBase::testCaseEnded(const TestCaseStats &)");
}

Assistant:

virtual void testCaseEnded( TestCaseStats const& /* _testCaseStats */ ) {
            currentTestCaseInfo.reset();
            assert( m_sectionStack.empty() );
        }